

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.h
# Opt level: O0

T_INDEX __thiscall
Nova::Grid<float,_3>::Closest_Node(Grid<float,_3> *this,TV *X,int number_of_ghost_cells)

{
  int in_ECX;
  undefined4 in_register_00000014;
  TV TVar1;
  T_INDEX TVar2;
  Range<int,_3> local_6c;
  Vector<float,_3,_true> local_54;
  Vector<float,_3,_true> local_48;
  Vector<float,_3,_true> local_3c;
  undefined1 local_30 [8];
  T_INDEX index;
  int number_of_ghost_cells_local;
  TV *X_local;
  Grid<float,_3> *this_local;
  
  register0x00000010 =
       (Vector<float,_3,_true> *)CONCAT44(in_register_00000014,number_of_ghost_cells);
  index._data._M_elems[1] = in_ECX;
  Vector<float,_3,_true>::operator-(&local_54,register0x00000010);
  Vector<float,_3,_true>::operator*(&local_48,&local_54);
  Vector<float,_3,_true>::operator+(&local_3c,1.5);
  Vector<int,_3,_true>::Vector<float>((Vector<int,_3,_true> *)local_30,&local_3c);
  Node_Indices(&local_6c,(Grid<float,_3> *)X,index._data._M_elems[1]);
  TVar1 = Range<int,_3>::Clamp((Range<int,_3> *)this,&local_6c.min_corner);
  TVar2._data._M_elems[2] = TVar1._data._M_elems[2];
  TVar2._data._M_elems._0_8_ = this;
  return (T_INDEX)TVar2._data._M_elems;
}

Assistant:

T_INDEX Closest_Node(const TV& X,const int number_of_ghost_cells=0) const
    {
        T_INDEX index((X-domain.min_corner)*one_over_dX+(T)1.5);
        return Node_Indices(number_of_ghost_cells).Clamp(index);
    }